

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qsbr.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_208d5::QSBR_TwoThreadsDeallocateBeforeQuittingPointerStaysLive_Test::TestBody
          (QSBR_TwoThreadsDeallocateBeforeQuittingPointerStaysLive_Test *this)

{
  long lVar1;
  qsbr_epoch qVar2;
  char *pcVar3;
  __uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> _Var4;
  undefined8 *puVar5;
  qsbr *this_00;
  long **__stat_loc;
  long local_48;
  long *local_40;
  __uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> local_38;
  __single_object new_qsbr_per_thread;
  qsbr_thread second_thread;
  
  pcVar3 = (char *)unodb::test::QSBRTestBase::allocate();
  _Var4._M_t.
  super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>.
  super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl =
       (tuple<unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>)
       operator_new(0x98);
  puVar5 = (undefined8 *)operator_new(0x20);
  *puVar5 = 0;
  puVar5[1] = 0;
  puVar5[2] = 0;
  puVar5[3] = 0;
  *(undefined8 **)
   _Var4._M_t.
   super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>.
   super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl = puVar5;
  puVar5 = (undefined8 *)operator_new(0x20);
  *puVar5 = 0;
  puVar5[1] = 0;
  puVar5[2] = 0;
  puVar5[3] = 0;
  *(undefined8 **)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 8) = puVar5;
  *(undefined8 *)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x10) = 0;
  this_00 = unodb::qsbr::instance();
  qVar2 = unodb::qsbr::register_thread(this_00);
  *(epoch_type *)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x18) =
       qVar2.epoch_val;
  *(epoch_type *)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x19) =
       qVar2.epoch_val;
  *(undefined8 *)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined8 *)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x31) = 0;
  *(undefined8 *)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x39) = 0;
  *(undefined8 *)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x41) = 0;
  *(undefined8 *)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x49) = 0;
  *(undefined8 **)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x60) =
       (undefined8 *)
       ((long)_Var4._M_t.
              super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
              .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x90);
  *(undefined8 *)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x68) = 1;
  *(undefined1 (*) [16])
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x70) =
       ZEXT416(0) << 0x40;
  *(undefined4 *)
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x80) = 0x3f800000;
  *(undefined1 (*) [16])
   ((long)_Var4._M_t.
          super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
          .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl + 0x88) =
       ZEXT416(0) << 0x40;
  local_38._M_t.
  super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>.
  super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl =
       (tuple<unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>)
       (_Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>)0x0
  ;
  local_48 = 0;
  new_qsbr_per_thread._M_t.
  super___uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>._M_t.
  super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>.
  super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl =
       (__uniq_ptr_data<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>,_true,_true>
        )(__uniq_ptr_data<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>,_true,_true>
          )_Var4._M_t.
           super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
           .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl;
  local_40 = (long *)operator_new(0x18);
  *local_40 = (long)&PTR___State_impl_001775d8;
  local_40[1] = (long)pcVar3;
  ((__uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> *)
  (local_40 + 2))->_M_t =
       _Var4._M_t.
       super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
       .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl;
  new_qsbr_per_thread._M_t.
  super___uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>._M_t.
  super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>.
  super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl =
       (__uniq_ptr_data<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>,_true,_true>
        )(__uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>)0x0;
  __stat_loc = &local_40;
  std::thread::_M_start_thread(&local_48,__stat_loc,0);
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 8))();
  }
  std::unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>::~unique_ptr
            (&new_qsbr_per_thread);
  std::unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>::~unique_ptr
            ((unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> *)
             &local_38);
  lVar1 = local_48;
  unodb::detail::thread_sync::wait((thread_sync *)unodb::detail::thread_syncs,__stat_loc);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  std::thread::join();
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  unodb::test::allocation_failure_injector::allocation_counter.super___atomic_base<unsigned_long>.
  _M_i = (__atomic_base<unsigned_long>)0;
  *pcVar3 = unodb::test::QSBRTestBase::touch_memory(char*,char)::value;
  unodb::test::QSBRTestBase::touch_memory(char*,char)::value =
       unodb::test::QSBRTestBase::touch_memory(char*,char)::value + '\x01';
  unodb::test::QSBRTestBase::quiescent();
  if (lVar1 == 0) {
    return;
  }
  std::terminate();
}

Assistant:

UNODB_TEST_F(QSBR, TwoThreadsDeallocateBeforeQuittingPointerStaysLive) {
  auto *ptr = static_cast<char *>(allocate());

  unodb::qsbr_thread second_thread{[ptr] {
    qsbr_deallocate(ptr);
    thread_syncs[0].notify();  // 1 ->
  }};

  thread_syncs[0].wait();  // 1 <-
  join(second_thread);

  touch_memory(ptr);

  quiescent();
}